

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GetConfigAttribTransparentValueCase::executeTest
          (GetConfigAttribTransparentValueCase *this,EGLConfig config)

{
  MessageBuilder *this_00;
  MessageBuilder local_1c0;
  EGLint local_3c;
  EGLint local_38;
  EGLint blueSize;
  EGLint greenSize;
  EGLint redSize;
  EGLint blueValue;
  EGLint greenValue;
  EGLint redValue;
  EGLint transparentType;
  TestLog *log;
  EGLConfig config_local;
  GetConfigAttribTransparentValueCase *this_local;
  
  log = (TestLog *)config;
  config_local = this;
  _redValue = tcu::TestContext::getLog
                        ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx);
  greenValue = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,log,0x3034,true);
  blueValue = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,log,0x3037,true);
  redSize = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,log,0x3036,true);
  greenSize = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,log,0x3035,true);
  blueSize = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,log,0x3024,true);
  local_38 = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,log,0x3023,true);
  local_3c = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,log,0x3022,true);
  if ((greenValue == 0x3052) &&
     ((((blueValue < 0 || (1 << ((byte)blueSize & 0x1f) <= blueValue)) || (redSize < 0)) ||
      (((1 << ((byte)local_38 & 0x1f) <= redSize || (greenSize < 0)) ||
       (1 << ((byte)local_3c & 0x1f) <= greenSize)))))) {
    tcu::TestLog::operator<<(&local_1c0,_redValue,(BeginMessageToken *)&tcu::TestLog::Message);
    this_00 = tcu::MessageBuilder::operator<<
                        (&local_1c0,
                         (char (*) [83])
                         "Fail, transparent color values must lie between 0 and the maximum component value."
                        );
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
    tcu::TestContext::setTestResult
              ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Invalid transparent color value");
  }
  return;
}

Assistant:

void executeTest (EGLConfig config)
	{
		TestLog&		log	= m_testCtx.getLog();

		const EGLint	transparentType	= getValue(config, EGL_TRANSPARENT_TYPE);
		const EGLint	redValue		= getValue(config, EGL_TRANSPARENT_RED_VALUE);
		const EGLint	greenValue		= getValue(config, EGL_TRANSPARENT_GREEN_VALUE);
		const EGLint	blueValue		= getValue(config, EGL_TRANSPARENT_BLUE_VALUE);

		const EGLint	redSize			= getValue(config, EGL_RED_SIZE);
		const EGLint	greenSize		= getValue(config, EGL_GREEN_SIZE);
		const EGLint	blueSize		= getValue(config, EGL_BLUE_SIZE);

		if (transparentType == EGL_TRANSPARENT_RGB)
		{
			if (   (redValue	< 0	|| redValue		>= (1 << redSize))
				|| (greenValue	< 0	|| greenValue	>= (1 << greenSize))
				|| (blueValue	< 0	|| blueValue	>= (1 << blueSize))	)
			{
				log << TestLog::Message << "Fail, transparent color values must lie between 0 and the maximum component value." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid transparent color value");
			}
		}
	}